

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase630::run(TestCase630 *this)

{
  bool bVar1;
  AsyncIoProvider *pAVar2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *stream;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> *other;
  bool local_211;
  DebugExpression<const_char_(&)[4]> DStack_210;
  bool _kj_shouldLog_1;
  undefined1 local_208 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition_1;
  DebugExpression<const_char_(&)[4]> DStack_1d8;
  bool _kj_shouldLog;
  undefined1 local_1d0 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  SourceLocation local_1a0;
  undefined1 local_188 [8];
  String result2;
  SourceLocation local_168;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> local_130;
  undefined1 local_120 [16];
  Type local_110;
  Promise<unsigned_long> local_108;
  undefined1 local_100 [8];
  String result;
  undefined1 local_c8 [8];
  Type local_c0;
  Promise<unsigned_long> local_b0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:646:11),_unsigned_long>
  promise;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  CapabilityPipe pipe2;
  undefined1 local_60 [8];
  CapabilityPipe pipe;
  AsyncIoContext ioContext;
  TestCase630 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar2 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar2->_vptr_AsyncIoProvider[2])(local_60);
  pAVar2 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  (*pAVar2->_vptr_AsyncIoProvider[2])(receiveBuffer2);
  receivedStream.ptr._4_4_ = 0;
  receivedStream.ptr._0_4_ = 0;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&promise);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe2.ends[0].ptr);
  AsyncCapabilityStream::receiveStream((AsyncCapabilityStream *)local_c8);
  Promise<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>::
  then<kj::(anonymous_namespace)::TestCase630::run()::__0>
            ((Promise<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>> *)(local_c8 + 8),
             (Type *)local_c8);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase630::run()::__1>
            ((Promise<void> *)&local_c0.receiveBuffer2,(Type *)(local_c8 + 8));
  result.content.disposer = (ArrayDisposer *)&receivedStream.ptr;
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase630::run()::__2>
            (&local_b0,(Type *)&local_c0.receiveBuffer2);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_c0.receiveBuffer2);
  Promise<void>::~Promise((Promise<void> *)(local_c8 + 8));
  Promise<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> *)local_c8);
  stream = (Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)
           Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)receiveBuffer2);
  other = mv<kj::Own<kj::AsyncCapabilityStream,decltype(nullptr)>>
                    ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe.ends[0].ptr);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own(&local_130,other);
  AsyncCapabilityStream::sendStream((AsyncCapabilityStream *)local_120,stream);
  local_138 = local_60;
  Promise<void>::then<kj::(anonymous_namespace)::TestCase630::run()::__3>
            ((Promise<void> *)(local_120 + 8),(Type *)local_120);
  local_148 = local_60;
  local_140 = (undefined1 *)((long)&receivedStream.ptr + 4);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase630::run()::__4>
            ((Promise<void> *)&local_110,(Type *)(local_120 + 8));
  local_150 = (undefined1 *)((long)&receivedStream.ptr + 4);
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase630::run()::__5>
            (&local_108,&local_110);
  SourceLocation::SourceLocation
            (&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x28d,0x17);
  Promise<kj::String>::wait((Promise<kj::String> *)local_100,&local_108);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_108);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_110);
  Promise<void>::~Promise((Promise<void> *)(local_120 + 8));
  Promise<void>::~Promise((Promise<void> *)local_120);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own(&local_130);
  SourceLocation::SourceLocation
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x297,0x18);
  Promise<kj::String>::wait((Promise<kj::String> *)local_188,&local_b0);
  DStack_1d8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x91cc8d);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1d0,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffe28,(String *)local_100);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x299,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result"
                 ,(char (*) [37])"failed: expected (\"bar\") == (result)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1d0,
                 (char (*) [4])0x91cc8d,(String *)local_100);
      _kjCondition_1._39_1_ = 0;
    }
  }
  DStack_210 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_208,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffdf0,(String *)local_188);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x29a,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
                 ,(char (*) [38])"failed: expected (\"foo\") == (result2)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_208,
                 (char (*) [4])0x9422c6,(String *)local_188);
      local_211 = false;
    }
  }
  String::~String((String *)local_188);
  String::~String((String *)local_100);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_b0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&promise);
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)receiveBuffer2);
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipe.ends[1].ptr);
  return;
}

Assistant:

TEST(AsyncIo, CapabilityPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Expect to receive a stream, then write "bar" to it, then receive "foo" from it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise = pipe2.ends[1]->receiveStream()
      .then([&](Own<AsyncCapabilityStream> stream) {
    receivedStream = kj::mv(stream);
    return receivedStream->write("bar"_kjb);
  }).then([&]() {
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  });

  // Send a stream, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  kj::String result = pipe2.ends[0]->sendStream(kj::mv(pipe.ends[1]))
      .then([&]() {
    return pipe.ends[0]->write("foo"_kjb);
  }).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}